

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1512.c
# Opt level: O0

int test(char *URL)

{
  char *pcVar1;
  undefined8 uVar2;
  int iVar3;
  undefined8 uVar4;
  CURL *pCVar5;
  undefined8 uVar6;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  CURLcode ec;
  char target_url [256];
  int i;
  curl_slist *slist;
  char dnsentry [256];
  char *address;
  char *port;
  CURL *curl [2];
  int local_1c;
  int res;
  char *URL_local;
  
  local_1c = 0;
  memset(&port,0,0x10);
  pcVar1 = libtest_arg3;
  dnsentry._248_8_ = libtest_arg2;
  iVar3 = curl_global_init(3);
  if (iVar3 == 0) {
    curl_msnprintf(&slist,0x100,"server.example.curl:%s:%s",pcVar1,dnsentry._248_8_);
    curl_mprintf("%s\n",&slist);
    uVar4 = curl_slist_append(0,&slist);
    target_url[0xfc] = '\0';
    target_url[0xfd] = '\0';
    target_url[0xfe] = '\0';
    target_url[0xff] = '\0';
    for (; (int)target_url._252_4_ < 2; target_url._252_4_ = target_url._252_4_ + 1) {
      pCVar5 = (CURL *)curl_easy_init();
      curl[(long)(int)target_url._252_4_ + -1] = pCVar5;
      if (pCVar5 == (CURL *)0x0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1512.c"
                      ,0x3c);
        local_1c = 0x7c;
      }
      if (local_1c != 0) goto LAB_0010271a;
      curl_msnprintf(&ec_1,0x100,"http://server.example.curl:%s/path/1512%04i",pcVar1,
                     target_url._252_4_ + 1);
      target_url[0xf7] = '\0';
      iVar3 = curl_easy_setopt(curl[(long)(int)target_url._252_4_ + -1],0x2712,&ec_1);
      uVar2 = _stderr;
      if (iVar3 != 0) {
        uVar6 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1512.c"
                      ,0x42,iVar3,uVar6);
        local_1c = iVar3;
      }
      if (local_1c != 0) goto LAB_0010271a;
      iVar3 = curl_easy_setopt(curl[(long)(int)target_url._252_4_ + -1],0x29,1);
      uVar2 = _stderr;
      if (iVar3 != 0) {
        uVar6 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1512.c"
                      ,0x44,iVar3,uVar6);
        local_1c = iVar3;
      }
      if (local_1c != 0) goto LAB_0010271a;
      iVar3 = curl_easy_setopt(curl[(long)(int)target_url._252_4_ + -1],0x2a,1);
      uVar2 = _stderr;
      if (iVar3 != 0) {
        uVar6 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1512.c"
                      ,0x46,iVar3,uVar6);
        local_1c = iVar3;
      }
      if (local_1c != 0) goto LAB_0010271a;
      iVar3 = curl_easy_setopt(curl[(long)(int)target_url._252_4_ + -1],0x5b,1);
      uVar2 = _stderr;
      if (iVar3 != 0) {
        uVar6 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1512.c"
                      ,0x48,iVar3,uVar6);
        local_1c = iVar3;
      }
      if (local_1c != 0) goto LAB_0010271a;
    }
    iVar3 = curl_easy_setopt(port,0x27db,uVar4);
    uVar2 = _stderr;
    if (iVar3 != 0) {
      uVar6 = curl_easy_strerror(iVar3);
      curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib1512.c"
                    ,0x4c,iVar3,uVar6);
      local_1c = iVar3;
    }
    if (local_1c == 0) {
      target_url[0xfc] = '\0';
      target_url[0xfd] = '\0';
      target_url[0xfe] = '\0';
      target_url[0xff] = '\0';
      for (; (int)target_url._252_4_ < 2 && local_1c == 0;
          target_url._252_4_ = target_url._252_4_ + 1) {
        local_1c = curl_easy_perform(curl[(long)(int)target_url._252_4_ + -1]);
      }
    }
LAB_0010271a:
    curl_easy_cleanup(port);
    curl_easy_cleanup(curl[0]);
    curl_slist_free_all(uVar4);
    curl_global_cleanup();
    URL_local._4_4_ = local_1c;
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES] = {NULL, NULL};
  char *port = libtest_arg3;
  char *address = libtest_arg2;
  char dnsentry[256];
  struct curl_slist *slist = NULL;
  int i;
  char target_url[256];
  (void)URL; /* URL is setup in the code */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  msnprintf(dnsentry, sizeof(dnsentry), "server.example.curl:%s:%s",
            port, address);
  printf("%s\n", dnsentry);
  slist = curl_slist_append(slist, dnsentry);

  /* get NUM_HANDLES easy handles */
  for(i = 0; i < NUM_HANDLES; i++) {
    /* get an easy handle */
    easy_init(curl[i]);
    /* specify target */
    msnprintf(target_url, sizeof(target_url),
              "http://server.example.curl:%s/path/1512%04i",
              port, i + 1);
    target_url[sizeof(target_url) - 1] = '\0';
    easy_setopt(curl[i], CURLOPT_URL, target_url);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
    /* include headers */
    easy_setopt(curl[i], CURLOPT_HEADER, 1L);

    easy_setopt(curl[i], CURLOPT_DNS_USE_GLOBAL_CACHE, 1L);
  }

  /* make the first one populate the GLOBAL cache */
  easy_setopt(curl[0], CURLOPT_RESOLVE, slist);

  /* run NUM_HANDLES transfers */
  for(i = 0; (i < NUM_HANDLES) && !res; i++)
    res = curl_easy_perform(curl[i]);

test_cleanup:

  curl_easy_cleanup(curl[0]);
  curl_easy_cleanup(curl[1]);
  curl_slist_free_all(slist);
  curl_global_cleanup();

  return res;
}